

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadContactSurfaceMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadContactSurfaceMesh::LoadStateIncrement
          (ChLoadContactSurfaceMesh *this,ChState *x,ChStateDelta *dw,ChState *x_new)

{
  pointer psVar1;
  ChLoadContactSurfaceMesh *pCVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int local_64;
  long *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  ChLoadContactSurfaceMesh *local_50;
  ChState *local_48;
  ChStateDelta *local_40;
  ChState *local_38;
  
  lVar6 = 0;
  iVar5 = 0;
  local_64 = 0;
  local_50 = this;
  local_48 = x;
  local_40 = dw;
  local_38 = x_new;
  for (uVar7 = 0; pCVar2 = local_50,
      psVar1 = (local_50->forces).
               super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(local_50->forces).
                            super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
      uVar7 = uVar7 + 1) {
    std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadableUVW,void>
              ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(psVar1->
                                 super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar6) + 0x58));
    (**(code **)(*local_60 + 0x30))(local_60,iVar5,local_38,local_48,local_64,local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadableUVW,void>
              ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(((pCVar2->forces).
                                   super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar6) + 0x58));
    iVar3 = (**(code **)(*local_60 + 0x10))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadableUVW,void>
              ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(((pCVar2->forces).
                                   super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar6) + 0x58));
    iVar4 = (**(code **)(*local_60 + 0x18))();
    local_64 = local_64 + iVar4;
    iVar5 = iVar5 + iVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    lVar6 = lVar6 + 0x10;
  }
  return;
}

Assistant:

void ChLoadContactSurfaceMesh::LoadStateIncrement(const ChState& x, const ChStateDelta& dw, ChState& x_new) {
    int ndoftotx = 0;
    int ndoftotw = 0;
    for (int i = 0; i < forces.size(); ++i) {
        forces[i]->loader.GetLoadable()->LoadableStateIncrement(ndoftotx, x_new, x, ndoftotw, dw);
        ndoftotx += forces[i]->loader.GetLoadable()->LoadableGet_ndof_x();
        ndoftotw += forces[i]->loader.GetLoadable()->LoadableGet_ndof_w();
    }
}